

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::setup(ClaspAppBase *this)

{
  bool bVar1;
  uint uVar2;
  Verbosity VVar3;
  Verbosity *pVVar4;
  Output *pOVar5;
  ulong uVar6;
  char *pcVar7;
  ClaspFacade *pCVar8;
  LemmaLogger *pLVar9;
  Application *in_RDI;
  Verbosity verb;
  ProblemType pt;
  ClaspFacade *in_stack_ffffffffffffff78;
  SharedContext *this_00;
  SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *in_stack_ffffffffffffff80;
  Application *r;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar10;
  allocator in_stack_ffffffffffffffb7;
  string *in_stack_ffffffffffffffb8;
  ClaspFacade *in_stack_ffffffffffffffc0;
  uint local_28;
  uint local_24;
  Verbosity local_20;
  uint local_c;
  
  local_c = (*in_RDI->_vptr_Application[0x15])();
  operator_new(0x1a8);
  ClaspFacade::ClaspFacade(in_stack_ffffffffffffffc0);
  SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator=
            ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  bVar1 = setFpuMode();
  if (bVar1) {
    uVar2 = fpuInit();
    in_RDI[0xe].exitCode_ = uVar2;
  }
  if (*(char *)((long)&in_RDI[0xd].exitCode_ + 1) == '\0') {
    (*in_RDI->_vptr_Application[0x18])(in_RDI,(ulong)local_c);
    SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)in_stack_ffffffffffffff80,
               (Output *)in_stack_ffffffffffffff78);
    local_24 = Potassco::Application::verbose(in_RDI);
    local_28 = 3;
    pVVar4 = std::min<unsigned_int>(&local_24,&local_28);
    local_20 = *pVVar4;
    pOVar5 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116a0e);
    if (pOVar5 != (Output *)0x0) {
      pOVar5 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116a25);
      VVar3 = Output::verbosity(pOVar5);
      if (VVar3 < local_20) {
        pOVar5 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                           ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116a44);
        local_20 = Output::verbosity(pOVar5);
      }
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      operator_new(0x40);
      uVar10 = 1;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb8,pcVar7,(allocator *)&stack0xffffffffffffffb7);
      LemmaLogger::LemmaLogger
                ((LemmaLogger *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (Options *)
                 CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(uVar10,in_stack_ffffffffffffffb0)));
      SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::operator=
                (in_stack_ffffffffffffff80,(LemmaLogger *)in_stack_ffffffffffffff78);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    }
    EventHandler::setVerbosity((EventHandler *)(in_RDI + 1),subsystem_facade,local_20);
    EventHandler::setVerbosity((EventHandler *)(in_RDI + 1),subsystem_load,local_20);
    EventHandler::setVerbosity((EventHandler *)(in_RDI + 1),subsystem_prepare,local_20);
    EventHandler::setVerbosity((EventHandler *)(in_RDI + 1),subsystem_solve,local_20);
    pCVar8 = SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x116bc0);
    this_00 = &pCVar8->ctx;
    r = in_RDI + 1;
    pLVar9 = SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x116be5);
    SharedContext::setEventHandler(this_00,(LogPtr)r,(uint)(pLVar9 != (LemmaLogger *)0x0));
  }
  return;
}

Assistant:

void ClaspAppBase::setup() {
	ProblemType pt = getProblemType();
	clasp_         = new ClaspFacade();
	if (setFpuMode()) { fpuMode_ = fpuInit(); }
	if (!claspAppOpts_.onlyPre) {
		out_ = createOutput(pt);
		Event::Verbosity verb	= (Event::Verbosity)std::min(verbose(), (uint32)Event::verbosity_max);
		if (out_.get() && out_->verbosity() < (uint32)verb) { verb = (Event::Verbosity)out_->verbosity(); }
		if (!claspAppOpts_.lemmaLog.empty()) {
			logger_ = new LemmaLogger(claspAppOpts_.lemmaLog.c_str(), claspAppOpts_.lemma);
		}
		EventHandler::setVerbosity(Event::subsystem_facade , verb);
		EventHandler::setVerbosity(Event::subsystem_load   , verb);
		EventHandler::setVerbosity(Event::subsystem_prepare, verb);
		EventHandler::setVerbosity(Event::subsystem_solve  , verb);
		clasp_->ctx.setEventHandler(this, logger_.get() == 0 ? SharedContext::report_default : SharedContext::report_conflict);
	}
}